

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O1

bool __thiscall
google::protobuf::MergedDescriptorDatabase::FindFileContainingExtension
          (MergedDescriptorDatabase *this,string *containing_type,int field_number,
          FileDescriptorProto *output)

{
  pointer ppDVar1;
  DescriptorDatabase *pDVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  ulong unaff_R12;
  ulong uVar6;
  bool bVar7;
  bool bVar8;
  undefined1 local_118 [8];
  FileDescriptorProto temp;
  ulong local_38;
  
  ppDVar1 = (this->sources_).
            super__Vector_base<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  bVar7 = (this->sources_).
          super__Vector_base<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
          ._M_impl.super__Vector_impl_data._M_finish != ppDVar1;
  if (bVar7) {
    unaff_R12 = (ulong)(uint)field_number;
    temp.source_code_info_ = (SourceCodeInfo *)output;
    iVar3 = (*(*ppDVar1)->_vptr_DescriptorDatabase[4])();
    if ((char)iVar3 == '\0') {
      uVar4 = 0;
      do {
        uVar6 = uVar4 + 1;
        ppDVar1 = (this->sources_).
                  super__Vector_base<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        uVar5 = (long)(this->sources_).
                      super__Vector_base<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppDVar1 >> 3;
        bVar7 = uVar6 < uVar5;
        if (uVar5 <= uVar6) goto LAB_002b463f;
        pDVar2 = ppDVar1[uVar4 + 1];
        iVar3 = (*pDVar2->_vptr_DescriptorDatabase[4])
                          (pDVar2,containing_type,unaff_R12,temp.source_code_info_);
        uVar4 = uVar6;
      } while ((char)iVar3 == '\0');
      local_38 = uVar6 & 0xffffffff;
    }
    else {
      local_38 = 0;
      uVar6 = 0;
    }
    FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)local_118,(Arena *)0x0);
    unaff_R12 = (ulong)(uVar6 == 0);
    if (uVar6 != 0) {
      uVar4 = 1;
      do {
        pDVar2 = (this->sources_).
                 super__Vector_base<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar4 - 1];
        iVar3 = (*pDVar2->_vptr_DescriptorDatabase[2])
                          (pDVar2,temp.source_code_info_[3].location_.super_RepeatedPtrFieldBase.
                                  rep_,local_118);
        if ((char)iVar3 != '\0') break;
        unaff_R12 = (ulong)((uVar6 & 0xffffffff) <= uVar4);
        bVar8 = uVar4 != local_38;
        uVar4 = uVar4 + 1;
      } while (bVar8);
    }
    FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)local_118);
  }
LAB_002b463f:
  return (bool)(bVar7 & (byte)unaff_R12);
}

Assistant:

bool MergedDescriptorDatabase::FindFileContainingExtension(
    const std::string& containing_type, int field_number,
    FileDescriptorProto* output) {
  for (int i = 0; i < sources_.size(); i++) {
    if (sources_[i]->FindFileContainingExtension(containing_type, field_number,
                                                 output)) {
      // The symbol was found in source i.  However, if one of the previous
      // sources defines a file with the same name (which presumably doesn't
      // contain the symbol, since it wasn't found in that source), then we
      // must hide it from the caller.
      FileDescriptorProto temp;
      for (int j = 0; j < i; j++) {
        if (sources_[j]->FindFileByName(output->name(), &temp)) {
          // Found conflicting file in a previous source.
          return false;
        }
      }
      return true;
    }
  }
  return false;
}